

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<Fad<double>,_FadCst<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>_>
::val(FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<Fad<double>,_FadCst<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>_>
      *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
  *pFVar4;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar5;
  FadExpr<FadBinaryMinus<Fad<double>,_FadCst<double>_>_> *pFVar6;
  FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *pFVar7;
  double dVar8;
  double dVar9;
  
  dVar1 = (this->left_->fadexpr_).left_.constant_;
  pFVar4 = (this->left_->fadexpr_).right_;
  pFVar5 = (pFVar4->fadexpr_).expr_.fadexpr_.left_;
  dVar8 = cos(((pFVar5->fadexpr_).left_.constant_ * ((pFVar5->fadexpr_).right_)->val_) /
              (pFVar4->fadexpr_).expr_.fadexpr_.right_.constant_);
  pFVar6 = (this->right_->fadexpr_).left_;
  pFVar7 = (this->right_->fadexpr_).right_;
  dVar2 = ((pFVar6->fadexpr_).left_)->val_;
  dVar3 = (pFVar6->fadexpr_).right_.constant_;
  dVar9 = cos((pFVar7->fadexpr_).expr_.fadexpr_.left_.constant_ *
              ((pFVar7->fadexpr_).expr_.fadexpr_.right_)->val_);
  return ((dVar2 - dVar3) - dVar9) * dVar8 * dVar1;
}

Assistant:

const value_type val() const {return left_.val() * right_.val() ;}